

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_reader.cc
# Opt level: O3

void __thiscall lf::io::GmshReader::InitGmshFile(GmshReader *this,GMshFileV2 *msh_file)

{
  pointer ppVar1;
  Geometry *pGVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  element_type *peVar4;
  _func_int **pp_Var5;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar6;
  _Bit_iterator *p_Var7;
  double dVar8;
  int iVar9;
  pointer pEVar10;
  MeshFactory *pMVar11;
  pointer puVar12;
  pointer puVar13;
  iterator iVar14;
  element_type *peVar15;
  Entity *e;
  uint *puVar16;
  pointer pcVar17;
  double *pdVar18;
  SegmentO2 *pSVar19;
  undefined8 uVar20;
  pointer pvVar21;
  undefined8 uVar22;
  RefEl RVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  size_type sVar27;
  dim_t dVar28;
  DstEvaluatorType dstEvaluator;
  pointer ppVar29;
  pointer pvVar30;
  SegmentO2 *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var31;
  undefined4 extraout_var;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar32;
  ostream *poVar33;
  runtime_error *prVar34;
  Mesh *__tmp;
  Index index;
  ulong uVar35;
  size_t __n;
  ulong uVar36;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var37;
  long extraout_RDX;
  ulong uVar38;
  dim_t i_1;
  long lVar39;
  pointer pEVar40;
  size_t sVar41;
  long i_00;
  uint i;
  long lVar42;
  ulong uVar43;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>>
  *p_Var44;
  pointer pPVar45;
  ulong uVar46;
  uint *gmsh_index;
  uint *puVar47;
  GmshReader *pGVar48;
  bool bVar49;
  initializer_list<unsigned_int> __l;
  RefEl ref_el_1;
  Matrix<double,_3,_1,_0,_3,_1> node_coord;
  MatrixXd node_coords;
  vector<unsigned_int,_std::allocator<unsigned_int>_> gi2mi;
  vector<unsigned_int,_std::allocator<unsigned_int>_> gi2i;
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  mi2gi;
  stringstream ss;
  RefEl local_341;
  SegmentO2 *local_340;
  undefined1 local_338 [40];
  undefined1 local_310 [32];
  uint local_2f0;
  GMshFileV2 *local_2d8;
  string local_2d0;
  ulong local_2b0;
  GmshReader *local_2a8;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>>
  *local_2a0;
  ulong local_298;
  vector<bool,_std::allocator<bool>_> local_290;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_268;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  uint local_22c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  double *local_208;
  undefined8 uStack_200;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1f8;
  ulong local_1e8;
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  local_1e0;
  undefined1 local_1c8 [16];
  variable_if_dynamic<long,__1> local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  uint local_1a0;
  Index local_198;
  ulong local_38;
  
  local_2d8 = msh_file;
  uVar24 = (*((this->mesh_factory_)._M_t.
              super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
              ._M_t.
              super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
              .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl)->
             _vptr_MeshFactory[1])();
  uVar25 = (**((this->mesh_factory_)._M_t.
               super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
               ._M_t.
               super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
               .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl)->
              _vptr_MeshFactory)();
  local_2b0 = (ulong)uVar24;
  if (((uVar24 & 0xfffffffe) != 2) || ((uVar25 & 0xfffffffe) != 2)) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8,"GmshReader supports only 2D and 3D meshes.",0x2a);
    local_310._0_8_ = (element_type *)(local_310 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_310,
               "dim_mesh >= 2 && dim_mesh <= 3 && dim_world >= 2 && dim_world <= 3","");
    p_Var7 = &local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish;
    local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)p_Var7;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_310,(string *)&local_290,0x80,(string *)local_338);
    if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
      operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
    }
    if ((_Bit_iterator *)
        local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != p_Var7) {
      operator_delete(local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + 1);
    }
    if ((element_type *)local_310._0_8_ != (element_type *)(local_310 + 0x10)) {
      operator_delete((void *)local_310._0_8_,CONCAT71(local_310._17_7_,local_310[0x10]) + 1);
    }
    prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar34,"this code should not be reached");
    __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2a0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>>
               *)CONCAT44(local_2a0._4_4_,uVar25);
  local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_290,
             (long)(local_2d8->Nodes).
                   super__Vector_base<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_2d8->Nodes).
                   super__Vector_base<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)local_1c8,
             (allocator_type *)local_310);
  local_1e8 = (ulong)((int)local_2b0 + 1);
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::vector(&local_1e0,local_1e8,(allocator_type *)local_1c8);
  iVar26 = (*((this->mesh_factory_)._M_t.
              super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
              ._M_t.
              super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
              .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl)->
             _vptr_MeshFactory[1])();
  local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffff00000000;
  local_2a8 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_248,(ulong)(iVar26 + 1),(value_type_conflict *)local_1c8,
             (allocator_type *)local_310);
  pEVar40 = (local_2d8->Elements).
            super__Vector_base<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar10 = (local_2d8->Elements).
            super__Vector_base<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar40 != pEVar10) {
    do {
      uVar24 = DimOf(pEVar40->Type);
      if ((uint)local_2b0 < uVar24) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b8,"mesh_factory->DimMesh() = ",0x1a);
        poVar33 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar33,", but msh-file contains entities with dimension ",0x30);
        iVar26 = DimOf(pEVar40->Type);
        std::ostream::operator<<(poVar33,iVar26);
        peVar4 = (element_type *)(local_310 + 0x10);
        local_310._0_8_ = peVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_310,"DimOf(e.Type) <= dim_mesh","");
        pp_Var5 = (_func_int **)(local_338 + 0x10);
        local_338._0_8_ = pp_Var5;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_310,(string *)local_338,0x99,&local_2d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if ((_func_int **)local_338._0_8_ != pp_Var5) {
          operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
        }
        if ((element_type *)local_310._0_8_ != peVar4) {
          operator_delete((void *)local_310._0_8_,CONCAT71(local_310._17_7_,local_310[0x10]) + 1);
        }
        local_310._0_8_ = peVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"false","");
        local_338._0_8_ = pp_Var5;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                   ,"");
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
        base::AssertionFailed((string *)local_310,(string *)local_338,0x99,&local_2d0);
        goto LAB_001eb296;
      }
      iVar26 = DimOf(pEVar40->Type);
      local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[iVar26] =
           local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[iVar26] + 1;
      if (pEVar40->Type != POINT) {
        RVar23 = RefElOf(pEVar40->Type);
        local_1c8[0] = RVar23.type_;
        for (uVar46 = 0; sVar27 = base::RefEl::NumNodes((RefEl *)local_1c8), uVar46 < sVar27;
            uVar46 = uVar46 + 1) {
          uVar24 = (pEVar40->NodeNumbers).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar46];
          if ((ulong)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
              (long)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <=
              (ulong)uVar24) {
            std::vector<bool,_std::allocator<bool>_>::resize(&local_290,(ulong)(uVar24 + 1),false);
          }
          *(ulong *)((long)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                    (ulong)(uVar24 >> 6) * 8) =
               *(ulong *)((long)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         (ulong)(uVar24 >> 6) * 8) | 1L << ((byte)uVar24 & 0x3f);
        }
      }
      pEVar40 = pEVar40 + 1;
    } while (pEVar40 != pEVar10);
  }
  lVar39 = 0;
  uVar35 = local_2b0 & 0xffffffff;
  uVar46 = local_1e8;
  do {
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::reserve((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)((long)&((local_1e0.
                           super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar39),
              (ulong)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar35]);
    uVar35 = (ulong)((int)uVar35 - 1);
    lVar39 = lVar39 + 0x18;
    uVar46 = uVar46 - 1;
  } while (uVar46 != 0);
  local_338._32_8_ = local_2b0 & 0xffffffff;
  if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[local_338._32_8_] == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8,"MshFile contains no elements with dimension ",0x2c);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1b8);
    peVar4 = (element_type *)(local_310 + 0x10);
    local_310._0_8_ = peVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_310,"num_entities[dim_mesh] > 0","");
    pp_Var5 = (_func_int **)(local_338 + 0x10);
    local_338._0_8_ = pp_Var5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_310,(string *)local_338,0xaf,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if ((_func_int **)local_338._0_8_ != pp_Var5) {
      operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
    }
    if ((element_type *)local_310._0_8_ != peVar4) {
      operator_delete((void *)local_310._0_8_,CONCAT71(local_310._17_7_,local_310[0x10]) + 1);
    }
    local_310._0_8_ = peVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"false","");
    local_338._0_8_ = pp_Var5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
               ,"");
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
    base::AssertionFailed((string *)local_310,(string *)local_338,0xaf,&local_2d0);
LAB_001eb296:
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)local_338);
    std::__cxx11::string::~string((string *)local_310);
    abort();
  }
  operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_248,
             (ulong)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
             ((long)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
             (long)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8,
             (value_type_conflict *)local_1c8);
  uVar24 = (uint)local_2a0;
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_228,
             (ulong)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
             ((long)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
             (long)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8,
             (value_type_conflict *)local_1c8);
  ppVar29 = (local_2d8->Nodes).
            super__Vector_base<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((local_2d8->Nodes).
      super__Vector_base<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar29) {
    uVar46 = 0;
    do {
      ppVar1 = ppVar29 + uVar46;
      uVar35 = (ulong)ppVar29[uVar46].first;
      if ((ulong)((long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar35) {
        local_1c8._0_4_ = 0xffffffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (&local_228,(ulong)(ppVar29[uVar46].first + 1),(value_type_conflict *)local_1c8);
        uVar35 = (ulong)ppVar1->first;
      }
      local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar35] = (uint)uVar46;
      uVar25 = ppVar1->first;
      if (((ulong)uVar25 <
           (ulong)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
           ((long)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
           (long)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) &&
         ((*(ulong *)((long)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     (ulong)(uVar25 >> 6) * 8) >> ((ulong)uVar25 & 0x3f) & 1) != 0)) {
        if (uVar24 == 2) {
          dVar8 = (ppVar1->second).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[2];
          if ((dVar8 != 0.0) || (NAN(dVar8))) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b8,
                       "In a 2D GmshMesh, the z-coordinate of every node must be zero",0x3d);
            peVar4 = (element_type *)(local_310 + 0x10);
            local_310._0_8_ = peVar4;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_310,"n.second(2) == 0","");
            pp_Var5 = (_func_int **)(local_338 + 0x10);
            local_338._0_8_ = pp_Var5;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_338,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                       ,"");
            std::__cxx11::stringbuf::str();
            base::AssertionFailed((string *)local_310,(string *)local_338,0xcd,&local_2d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((_func_int **)local_338._0_8_ != pp_Var5) {
              operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
            }
            if ((element_type *)local_310._0_8_ != peVar4) {
              operator_delete((void *)local_310._0_8_,CONCAT71(local_310._17_7_,local_310[0x10]) + 1
                             );
            }
            local_310._0_8_ = peVar4;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"false","");
            local_338._0_8_ = pp_Var5;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_338,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                       ,"");
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
            base::AssertionFailed((string *)local_310,(string *)local_338,0xcd,&local_2d0);
            goto LAB_001eb296;
          }
          local_1c8._0_8_ = &ppVar1->second;
          pMVar11 = (local_2a8->mesh_factory_)._M_t.
                    super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl;
          local_1c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
          local_1b0._8_8_ = 0;
          local_198 = 3;
          local_1f8.m_storage.m_data = (double *)0x0;
          local_1f8.m_storage.m_rows = 0;
          local_1b0._M_allocated_capacity = local_1c8._0_8_;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_1f8,2,1);
          uVar20 = local_1c8._0_8_;
          Eigen::internal::
          resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,_1,1,false>,double,double>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)&local_1f8,
                     (Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false> *)local_1c8,
                     (assign_op<double,_double> *)local_310);
          uVar35 = local_1f8.m_storage.m_rows - (local_1f8.m_storage.m_rows >> 0x3f) &
                   0xfffffffffffffffe;
          if (1 < local_1f8.m_storage.m_rows) {
            lVar39 = 0;
            do {
              pGVar2 = (Geometry *)uVar20 + lVar39;
              pdVar18 = (((Matrix<double,__1,_3,_0,__1,_3> *)(pGVar2 + 1))->
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.
                        m_data;
              local_1f8.m_storage.m_data[lVar39] = (double)pGVar2->_vptr_Geometry;
              (local_1f8.m_storage.m_data + lVar39)[1] = (double)pdVar18;
              lVar39 = lVar39 + 2;
            } while (lVar39 < (long)uVar35);
          }
          if ((long)uVar35 < local_1f8.m_storage.m_rows) {
            do {
              local_1f8.m_storage.m_data[uVar35] =
                   (double)((Geometry *)uVar20)[uVar35]._vptr_Geometry;
              uVar35 = uVar35 + 1;
            } while (local_1f8.m_storage.m_rows != uVar35);
          }
          uVar24 = (*pMVar11->_vptr_MeshFactory[2])(pMVar11,&local_1f8);
          free(local_1f8.m_storage.m_data);
        }
        else {
          pMVar11 = (local_2a8->mesh_factory_)._M_t.
                    super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl;
          local_208 = (double *)0x0;
          uStack_200 = 0;
          local_208 = (double *)Eigen::internal::aligned_malloc(0x18);
          uStack_200 = 3;
          dVar8 = (ppVar1->second).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[1];
          *local_208 = (ppVar1->second).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                       .m_storage.m_data.array[0];
          local_208[1] = dVar8;
          local_208[2] = (ppVar1->second).
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[2];
          uVar24 = (*pMVar11->_vptr_MeshFactory[2])(pMVar11,&local_208);
          free(local_208);
        }
        local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[ppVar1->first] = uVar24;
        uVar24 = (uint)local_2a0;
      }
      uVar46 = uVar46 + 1;
      ppVar29 = (local_2d8->Nodes).
                super__Vector_base<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar46 < (ulong)((long)(local_2d8->Nodes).
                                    super__Vector_base<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar29 >> 5)
            );
  }
  pEVar40 = (local_2d8->Elements).
            super__Vector_base<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar46 = local_338._32_8_;
  if ((local_2d8->Elements).
      super__Vector_base<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>.
      _M_impl.super__Vector_impl_data._M_finish != pEVar40) {
    local_38 = (ulong)uVar24;
    uVar35 = 0;
    uVar43 = 0;
    do {
      local_298 = uVar43;
      local_341 = RefElOf(pEVar40[uVar43].Type);
      dVar28 = base::internal::DimensionImpl(local_341.type_);
      uVar24 = (int)local_2b0 - dVar28;
      puVar12 = pEVar40[uVar35].NodeNumbers.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar13 = pEVar40[uVar35].NodeNumbers.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      __n = (long)puVar13 - (long)puVar12;
      puVar47 = pEVar40[uVar43].NodeNumbers.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar41 = (long)pEVar40[uVar43].NodeNumbers.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar47;
      if (__n == sVar41) {
        if (puVar13 == puVar12) {
          bVar49 = false;
        }
        else {
          iVar26 = bcmp(puVar12,puVar47,__n);
          bVar49 = iVar26 != 0;
        }
        uVar38 = local_298;
        if ((uVar35 == local_298 || bVar49) || (pEVar40[uVar35].Type != pEVar40[uVar43].Type))
        goto LAB_001ea46a;
        pvVar30 = local_1e0.
                  super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar24].
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_1c8._0_4_ = (uint)local_298;
        iVar14._M_current =
             pvVar30[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar14._M_current ==
            pvVar30[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (pvVar30 + -1,iVar14,(uint *)local_1c8);
          uVar46 = local_338._32_8_;
        }
        else {
          *iVar14._M_current = (uint)local_298;
          pvVar30[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar14._M_current + 1;
          uVar46 = local_338._32_8_;
        }
        goto LAB_001eaab7;
      }
LAB_001ea46a:
      uVar35 = local_298;
      uVar46 = local_338._32_8_;
      if (local_341.type_ == kPoint) {
        uVar43 = (ulong)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[*puVar47];
        uVar38 = uVar35;
        if (uVar43 != 0xffffffff) {
          pvVar30 = local_1e0.
                    super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_338._32_8_].
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar36 = ((long)local_1e0.
                          super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_338._32_8_].
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar30 >> 3) *
                   -0x5555555555555555;
          if (uVar36 < uVar43 || uVar36 - uVar43 == 0) {
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::resize(local_1e0.
                     super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_338._32_8_,
                     (ulong)(local_248.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[*puVar47] + 1));
            pvVar30 = local_1e0.
                      super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar46].
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          pvVar32 = pvVar30 + uVar43;
          local_1c8._0_4_ = (uint)uVar35;
          iVar14._M_current =
               (pvVar32->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar14._M_current ==
              (pvVar32->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(pvVar32,iVar14,(uint *)local_1c8);
          }
          else {
            *iVar14._M_current = (uint)uVar35;
            (pvVar32->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar14._M_current + 1;
          }
        }
        goto LAB_001eaab7;
      }
      local_22c = uVar24;
      lVar39 = base::narrow<long,unsigned_long>((long)sVar41 >> 2);
      local_268.m_storage.m_data = (double *)0x0;
      local_268.m_storage.m_rows = 0;
      local_268.m_storage.m_cols = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                (&local_268,local_38,lVar39);
      if (0 < lVar39) {
        i_00 = 0;
        iVar26 = (uint)local_2a0;
        do {
          ppVar29 = (local_2d8->Nodes).
                    super__Vector_base<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pMVar6 = &ppVar29[local_228.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start
                            [pEVar40[uVar43].NodeNumbers.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[i_00]]].second;
          local_338._0_8_ =
               *(undefined8 *)
                &(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage;
          local_338._8_8_ =
               (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[1];
          local_338._16_8_ =
               ppVar29[local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [pEVar40[uVar43].NodeNumbers.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[i_00]]].second.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [2];
          if (iVar26 == 2) {
            local_1c8._0_8_ = local_338;
            local_1c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
            local_1b0._8_8_ = 0;
            local_198 = 3;
            local_1b0._M_allocated_capacity = local_1c8._0_8_;
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_310,
                       (Matrix<double,__1,__1,_0,__1,__1> *)&local_268,i_00);
            uVar20 = local_1c8._0_8_;
            Eigen::internal::
            resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>,double,double>
                      ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_310,
                       (Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false> *)local_1c8,
                       (assign_op<double,_double> *)&local_2d0);
            p_Var37 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_310._8_8_;
            if (((local_310._0_8_ & 7) == 0) &&
               (p_Var37 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          (ulong)((uint)((ulong)local_310._0_8_ >> 3) & 1),
               (long)local_310._8_8_ <= (long)p_Var37)) {
              p_Var37 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_310._8_8_;
            }
            if (0 < (long)p_Var37) {
              p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              do {
                *(_func_int ***)(local_310._0_8_ + (long)p_Var31 * 8) =
                     ((Geometry *)uVar20)[(long)p_Var31]._vptr_Geometry;
                p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&p_Var31->_vptr__Sp_counted_base + 1);
              } while (p_Var37 != p_Var31);
            }
            lVar42 = local_310._8_8_ - (long)p_Var37;
            p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&p_Var37->_vptr__Sp_counted_base +
                      (lVar42 - (lVar42 >> 0x3f) & 0xfffffffffffffffeU));
            if (1 < lVar42) {
              do {
                pdVar18 = (((Matrix<double,__1,_3,_0,__1,_3> *)
                           ((Geometry *)uVar20 + (long)p_Var37 + 1))->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.
                          m_data;
                *(_func_int ***)(local_310._0_8_ + (long)p_Var37 * 8) =
                     ((Geometry *)uVar20)[(long)p_Var37]._vptr_Geometry;
                *(double **)((pointer)(local_310._0_8_ + (long)p_Var37 * 8) + 8) = pdVar18;
                p_Var37 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&p_Var37->_vptr__Sp_counted_base + 2);
              } while ((long)p_Var37 < (long)p_Var31);
            }
            if ((long)p_Var31 < (long)local_310._8_8_) {
              do {
                *(_func_int ***)(local_310._0_8_ + (long)p_Var31 * 8) =
                     ((Geometry *)uVar20)[(long)p_Var31]._vptr_Geometry;
                p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&p_Var31->_vptr__Sp_counted_base + 1);
              } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_310._8_8_ != p_Var31);
            }
            iVar26 = (uint)local_2a0;
          }
          else {
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_1c8,
                       (Matrix<double,__1,__1,_0,__1,__1> *)&local_268,i_00);
            Eigen::internal::
            resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,3,1,0,3,1>,double,double>
                      ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_1c8,
                       (Matrix<double,_3,_1,_0,_3,_1> *)local_338,
                       (assign_op<double,_double> *)local_310);
            p_Var37 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_;
            if (((local_1c8._0_8_ & 7) == 0) &&
               (p_Var37 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          (ulong)((uint)((ulong)local_1c8._0_8_ >> 3) & 1),
               (long)local_1c8._8_8_ <= (long)p_Var37)) {
              p_Var37 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_;
            }
            if (0 < (long)p_Var37) {
              p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              do {
                ((Geometry *)local_1c8._0_8_)[(long)p_Var31]._vptr_Geometry =
                     *(_func_int ***)(local_338 + (long)p_Var31 * 8);
                p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&p_Var31->_vptr__Sp_counted_base + 1);
              } while (p_Var37 != p_Var31);
            }
            lVar42 = local_1c8._8_8_ - (long)p_Var37;
            p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&p_Var37->_vptr__Sp_counted_base +
                      (lVar42 - (lVar42 >> 0x3f) & 0xfffffffffffffffeU));
            if (1 < lVar42) {
              do {
                pdVar18 = *(double **)
                           (local_338 + (long)((long)&p_Var37[-1]._M_weak_count + 3) * 8 + 0x10);
                ((Geometry *)local_1c8._0_8_)[(long)p_Var37]._vptr_Geometry =
                     *(_func_int ***)(local_338 + (long)p_Var37 * 8);
                (((Matrix<double,__1,_3,_0,__1,_3> *)
                 ((Geometry *)local_1c8._0_8_ + (long)p_Var37 + 1))->
                super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_data =
                     pdVar18;
                p_Var37 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&p_Var37->_vptr__Sp_counted_base + 2);
              } while ((long)p_Var37 < (long)p_Var31);
            }
            if ((long)p_Var31 < (long)local_1c8._8_8_) {
              do {
                ((Geometry *)local_1c8._0_8_)[(long)p_Var31]._vptr_Geometry =
                     *(_func_int ***)(local_338 + (long)p_Var31 * 8);
                p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&p_Var31->_vptr__Sp_counted_base + 1);
              } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ != p_Var31);
            }
          }
          i_00 = i_00 + 1;
        } while (i_00 != lVar39);
      }
      local_340 = (SegmentO2 *)0x0;
      switch(pEVar40[uVar43].Type) {
      case EDGE2:
        local_341.type_ = kSegment;
        std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_1c8);
        break;
      case TRIA3:
        local_341.type_ = kTria;
        this_00 = (SegmentO2 *)operator_new(0x40);
        uVar46 = local_338._32_8_;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,3,0,-1,3>>::
        PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,3,0,_1,3>> *)local_1c8,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_268);
        geometry::TriaO1::TriaO1((TriaO1 *)this_00,(Matrix<double,__1,_3,_0,__1,_3> *)local_1c8);
        goto LAB_001ea90b;
      case QUAD4:
        local_341.type_ = kQuad;
        std::make_unique<lf::geometry::QuadO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_1c8);
        break;
      default:
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b8,"Gmsh element type ",0x12);
        poVar33 = io::operator<<((ostream *)&local_1b8,pEVar40[uVar43].Type);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar33," not (yet) supported by GmshReader.",0x23);
        local_310._0_8_ = (element_type *)(local_310 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"false","");
        local_338._0_8_ = local_338 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_310,(string *)local_338,0x122,&local_2d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
          operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
        }
        if ((element_type *)local_310._0_8_ != (element_type *)(local_310 + 0x10)) {
          operator_delete((void *)local_310._0_8_,CONCAT71(local_310._17_7_,local_310[0x10]) + 1);
        }
        prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar34,"this code should not be reached");
        __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      case EDGE3:
        local_341.type_ = kSegment;
        this_00 = (SegmentO2 *)operator_new(0x60);
        uVar46 = local_338._32_8_;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,3,0,-1,3>>::
        PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,3,0,_1,3>> *)local_1c8,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_268);
        geometry::SegmentO2::SegmentO2(this_00,(Matrix<double,__1,_3,_0,__1,_3> *)local_1c8);
LAB_001ea90b:
        free((void *)local_1c8._0_8_);
        pSVar19 = local_340;
        goto joined_r0x001ea92a;
      case TRIA6:
        local_341.type_ = kTria;
        std::make_unique<lf::geometry::TriaO2,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_1c8);
        break;
      case QUAD9:
        local_341.type_ = kQuad;
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true> *)local_1c8,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_268,0,0,local_268.m_storage.m_rows,8)
        ;
        uVar46 = local_338._32_8_;
        std::
        make_unique<lf::geometry::QuadO2,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>>
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true> *)local_310);
        uVar20 = local_310._0_8_;
        pSVar19 = local_340;
        local_310._0_8_ = (SegmentO2 *)0x0;
        local_340 = (SegmentO2 *)uVar20;
        if (pSVar19 != (SegmentO2 *)0x0) {
          (*(pSVar19->super_Geometry)._vptr_Geometry[0xb])();
          this_00 = local_340;
          pSVar19 = (SegmentO2 *)local_310._0_8_;
          goto joined_r0x001ea92a;
        }
        goto LAB_001ea991;
      case QUAD8:
        local_341.type_ = kQuad;
        std::make_unique<lf::geometry::QuadO2,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_1c8);
      }
      uVar20 = local_1c8._0_8_;
      uVar46 = local_338._32_8_;
      pSVar19 = local_340;
      local_1c8._0_8_ = (SegmentO2 *)0x0;
      local_340 = (SegmentO2 *)uVar20;
      if (pSVar19 != (SegmentO2 *)0x0) {
        (*(pSVar19->super_Geometry)._vptr_Geometry[0xb])();
        this_00 = local_340;
        pSVar19 = (SegmentO2 *)local_1c8._0_8_;
joined_r0x001ea92a:
        local_340 = this_00;
        if (pSVar19 != (SegmentO2 *)0x0) {
          (*(pSVar19->super_Geometry)._vptr_Geometry[0xb])();
        }
      }
LAB_001ea991:
      sVar27 = base::RefEl::NumNodes(&local_341);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,(ulong)sVar27,
                 (allocator_type *)local_310);
      for (uVar35 = 0; sVar27 = base::RefEl::NumNodes(&local_341), uVar35 < sVar27;
          uVar35 = uVar35 + 1) {
        *(uint *)((long)&((Geometry *)local_1c8._0_8_)->_vptr_Geometry + uVar35 * 4) =
             local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start
             [pEVar40[uVar43].NodeNumbers.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar35]];
      }
      pMVar11 = (local_2a8->mesh_factory_)._M_t.
                super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
                ._M_t.
                super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl;
      local_310._8_8_ = (long)(local_1c8._8_8_ - local_1c8._0_8_) >> 2;
      local_310._0_8_ = local_1c8._0_8_;
      (*pMVar11->_vptr_MeshFactory[4])
                (pMVar11,(ulong)local_341.type_,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_310,&local_340);
      pvVar21 = local_1e0.
                super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar35 = local_298;
      local_338._0_4_ = (int)local_298;
      __l._M_len = 1;
      __l._M_array = (iterator)local_338;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_310,__l,
                 (allocator_type *)&local_2d0);
      std::
      vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
      ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  *)(pvVar21 + local_22c),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_310);
      if ((SegmentO2 *)local_310._0_8_ != (SegmentO2 *)0x0) {
        operator_delete((void *)local_310._0_8_,
                        CONCAT71(local_310._17_7_,local_310[0x10]) - local_310._0_8_);
      }
      if ((SegmentO2 *)local_1c8._0_8_ != (SegmentO2 *)0x0) {
        operator_delete((void *)local_1c8._0_8_,local_1b8.m_value - local_1c8._0_8_);
      }
      if (local_340 != (SegmentO2 *)0x0) {
        (*(local_340->super_Geometry)._vptr_Geometry[0xb])();
      }
      free(local_268.m_storage.m_data);
      uVar38 = uVar35;
LAB_001eaab7:
      uVar43 = uVar38 + 1;
      pEVar40 = (local_2d8->Elements).
                super__Vector_base<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar43 < (ulong)((long)(local_2d8->Elements).
                                    super__Vector_base<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar40 >> 6)
            );
  }
  pGVar48 = local_2a8;
  (*((local_2a8->mesh_factory_)._M_t.
     super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>._M_t.
     super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
     super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl)->_vptr_MeshFactory[5])
            (local_1c8);
  p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_;
  uVar20 = local_1c8._0_8_;
  local_1c8._0_8_ = (element_type *)0x0;
  local_1c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pGVar48->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar20;
  p_Var37 = (pGVar48->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (pGVar48->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var31;
  if (p_Var37 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var37);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
    }
    p_Var31 = (pGVar48->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  }
  local_310._0_8_ =
       (pGVar48->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
    }
  }
  local_310._8_8_ = p_Var31;
  mesh::utils::make_AllCodimMeshDataSet<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((utils *)local_1c8,(shared_ptr<const_lf::mesh::Mesh> *)local_310);
  uVar22 = local_1c8._8_8_;
  uVar20 = local_1c8._0_8_;
  local_1c8._0_8_ = (PointerType)0x0;
  local_1c8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  p_Var37 = (pGVar48->physical_nrs_).
            super___shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (pGVar48->physical_nrs_).
  super___shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)uVar20;
  (pGVar48->physical_nrs_).
  super___shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar22;
  if ((p_Var37 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var37),
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)local_1c8._8_8_ !=
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_310._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_310._8_8_);
  }
  uVar35 = 0;
  local_298 = uVar46 * 3;
  do {
    peVar15 = (pGVar48->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    iVar26 = (*peVar15->_vptr_Mesh[2])(peVar15,uVar35 & 0xffffffff);
    p_Var44 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>>
               *)CONCAT44(extraout_var,iVar26);
    if (extraout_RDX != 0) {
      local_2a0 = p_Var44 + extraout_RDX * 8;
      do {
        e = *(Entity **)p_Var44;
        peVar15 = (pGVar48->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        uVar24 = (*peVar15->_vptr_Mesh[5])(peVar15,e);
        uVar43 = (ulong)uVar24;
        if (((uVar35 != uVar46) ||
            (uVar38 = ((long)(&((local_1e0.
                                 super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish)[local_298] -
                       (long)(&((local_1e0.
                                 super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)[local_298] >> 3) *
                      -0x5555555555555555, uVar43 <= uVar38 && uVar38 - uVar43 != 0)) &&
           (uVar38 = ((long)local_1e0.
                            super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar35].
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1e0.
                            super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar35].
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           uVar43 <= uVar38 && uVar38 - uVar43 != 0)) {
          local_1c8._0_8_ = (PointerType)0x0;
          local_1c8._8_8_ = (uint *)0x0;
          local_1b8.m_value = 0;
          pvVar30 = local_1e0.
                    super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar35].
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar16 = pvVar30[uVar43].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (puVar47 = pvVar30[uVar43].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start; pGVar48 = local_2a8, puVar47 != puVar16;
              puVar47 = puVar47 + 1) {
            uVar24 = (local_2d8->Elements).
                     super__Vector_base<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>
                     ._M_impl.super__Vector_impl_data._M_start[*puVar47].PhysicalEntityNr;
            local_310._0_4_ = uVar24;
            if (local_1c8._8_8_ == local_1b8.m_value) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,
                         (iterator)local_1c8._8_8_,(uint *)local_310);
            }
            else {
              *(uint *)local_1c8._8_8_ = uVar24;
              local_1c8._8_8_ = local_1c8._8_8_ + 4;
            }
          }
          pvVar32 = mesh::utils::
                    AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                    operator()((local_2a8->physical_nrs_).
                               super___shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,e);
          puVar12 = (pvVar32->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar13 = (pvVar32->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          (pvVar32->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1c8._0_8_;
          (pvVar32->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
          (pvVar32->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_1b8.m_value;
          local_1c8._0_8_ = (PointerType)0x0;
          local_1c8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_1b8.m_value = 0;
          uVar46 = local_338._32_8_;
          if ((puVar12 != (pointer)0x0) &&
             (operator_delete(puVar12,(long)puVar13 - (long)puVar12), uVar46 = local_338._32_8_,
             (PointerType)local_1c8._0_8_ != (PointerType)0x0)) {
            operator_delete((void *)local_1c8._0_8_,local_1b8.m_value - local_1c8._0_8_);
            uVar46 = local_338._32_8_;
          }
        }
        p_Var44 = p_Var44 + 8;
      } while (p_Var44 != local_2a0);
    }
    uVar35 = uVar35 + 1;
  } while (uVar35 != local_1e8);
  pPVar45 = (local_2d8->PhysicalEntities).
            super__Vector_base<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_2d8 = (GMshFileV2 *)
              (local_2d8->PhysicalEntities).
              super__Vector_base<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if ((GMshFileV2 *)pPVar45 != local_2d8) {
    local_2a0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>>
                 *)&local_2a8->name_2_nr_;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_310 + 0x10);
    local_2a8 = (GmshReader *)&local_2a8->nr_2_name_;
    do {
      iVar26 = pPVar45->Dimension;
      iVar9 = pPVar45->Number;
      local_1c8._0_8_ = &local_1b8;
      pcVar17 = (pPVar45->Name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1c8,pcVar17,pcVar17 + (pPVar45->Name)._M_string_length);
      local_1b0._8_8_ = CONCAT44((int)local_2b0 - iVar26,iVar9);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>>
      ::_M_emplace_equal<std::pair<std::__cxx11::string,std::pair<int,unsigned_int>>>
                (local_2a0,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_unsigned_int>_>
                  *)local_1c8);
      if ((variable_if_dynamic<long,__1> *)local_1c8._0_8_ != &local_1b8) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8.m_value + 1));
      }
      uVar24 = (int)local_2b0 - pPVar45->Dimension;
      pcVar17 = (pPVar45->Name)._M_dataplus._M_p;
      local_310._0_8_ = paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_310,pcVar17,pcVar17 + (pPVar45->Name)._M_string_length);
      local_1c8._0_4_ = pPVar45->Number;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._0_8_ == paVar3) {
        local_1b0._8_8_ = local_310._24_8_;
        local_1c8._8_8_ = &local_1b0;
      }
      else {
        local_1c8._8_8_ = local_310._0_8_;
      }
      local_1b0._M_allocated_capacity._1_7_ = local_310._17_7_;
      local_1b0._M_local_buf[0] = local_310[0x10];
      local_1b8.m_value = local_310._8_8_;
      local_310._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_310[0x10] = '\0';
      local_310._0_8_ = paVar3;
      local_2f0 = uVar24;
      local_1a0 = uVar24;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>>>
      ::_M_emplace_equal<std::pair<int,std::pair<std::__cxx11::string,unsigned_int>>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>>>
                  *)local_2a8,
                 (pair<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                  *)local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._8_8_ != &local_1b0) {
        operator_delete((void *)local_1c8._8_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._0_8_ != paVar3) {
        operator_delete((void *)local_310._0_8_,CONCAT71(local_310._17_7_,local_310[0x10]) + 1);
      }
      pPVar45 = pPVar45 + 1;
    } while ((GMshFileV2 *)pPVar45 != local_2d8);
  }
  if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::~vector(&local_1e0);
  if (local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_290.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void GmshReader::InitGmshFile(const GMshFileV2& msh_file) {
  // 1) Check Gmsh_file and initialize
  //////////////////////////////////////////////////////////////////////////

  const dim_t dim_mesh = mesh_factory_->DimMesh();
  const dim_t dim_world = mesh_factory_->DimWorld();
  LF_VERIFY_MSG(
      dim_mesh >= 2 && dim_mesh <= 3 && dim_world >= 2 && dim_world <= 3,
      "GmshReader supports only 2D and 3D meshes.");

  // 1) Determine which nodes of gmsh are also nodes of the LehrFEM++ mesh +
  // count number of entities of each codimension (exclude auxilliary nodes).
  // This is necessary because e.g. second order meshes in gmsh need a lot of
  // auxilliary nodes to define their geometry...
  /////////////////////////////////////////////////////////////////////////////
  // is_main_node[i] = true means that gmsh-node i is one of the main nodes of
  // an element
  std::vector<bool> is_main_node(msh_file.Nodes.size(), false);

  // mi2gi = mesh_index_2_gmsh_index
  // mi2gi[c][i] contains the gmsh entities that belong to the mesh entity with
  //             codim = c and mesh index i.
  std::vector<std::vector<std::vector<size_type>>> mi2gi(dim_mesh + 1);

  {
    // count the number of entities for each codimension and reserve space:
    std::vector<size_type> num_entities(mesh_factory_->DimMesh() + 1, 0);

    for (const auto& e : msh_file.Elements) {
      LF_ASSERT_MSG(DimOf(e.Type) <= dim_mesh,
                    "mesh_factory->DimMesh() = "
                        << dim_mesh
                        << ", but msh-file contains entities with dimension "
                        << DimOf(e.Type));

      ++num_entities[DimOf(e.Type)];

      if (e.Type != GMshFileV2::ElementType::POINT) {
        // mark main nodes
        auto ref_el = RefElOf(e.Type);
        for (unsigned int i = 0; i < ref_el.NumNodes(); ++i) {
          auto node_number = e.NodeNumbers[i];
          if (is_main_node.size() <= node_number) {
            is_main_node.resize(node_number + 1);
          }
          is_main_node[node_number] = true;
        }
      }
    }

    for (dim_t c = 0; c <= dim_mesh; ++c) {
      mi2gi[c].reserve(num_entities[dim_mesh - c]);
    }

    LF_ASSERT_MSG(num_entities[dim_mesh] > 0,
                  "MshFile contains no elements with dimension " << dim_mesh);
  }

  // 2) Insert main nodes into MeshFactory
  /////////////////////////////////////////////////////////////////////////////

  // gmsh_index_2_mesh_index for nodes:
  // gi2mi[i] = j means that gmsh node with gmsh index i has mesh index j
  std::vector<size_type> gi2mi;
  gi2mi.resize(is_main_node.size(), -1);

  // gi2i[i] = j implies msh_file.Nodes[j].first = i
  std::vector<size_type> gi2i;
  gi2i.resize(is_main_node.size(), -1);

  for (std::size_t i = 0; i < msh_file.Nodes.size(); ++i) {
    const auto& n = msh_file.Nodes[i];
    if (gi2i.size() <= n.first) {
      gi2i.resize(n.first + 1, -1);
    }
    gi2i[n.first] = i;

    if (is_main_node.size() <= n.first || !is_main_node[n.first]) {
      continue;
    }

    size_type mi;
    if (dim_world == 2) {
      LF_ASSERT_MSG(
          n.second(2) == 0,
          "In a 2D GmshMesh, the z-coordinate of every node must be zero");
      mi = mesh_factory_->AddPoint(n.second.topRows(2));
    } else {
      mi = mesh_factory_->AddPoint(n.second);
    }
    gi2mi[n.first] = mi;
  }

  // 3) Insert entities (except nodes) into MeshFactory:
  //////////////////////////////////////////////////////////////////////////////

  std::size_t begin = 0;
  for (std::size_t end = 0; end < msh_file.Elements.size(); ++end) {
    const auto& begin_element = msh_file.Elements[begin];
    const auto& end_element = msh_file.Elements[end];
    auto ref_el = RefElOf(end_element.Type);
    auto codim = dim_mesh - ref_el.Dimension();
    if (begin_element.NodeNumbers == end_element.NodeNumbers && begin != end &&
        begin_element.Type == end_element.Type) {
      // This entity appears more than once
      mi2gi[codim].back().push_back(end);
      continue;
    }

    begin = end;
    if (ref_el == base::RefEl::kPoint()) {
      auto mesh_index = gi2mi[end_element.NodeNumbers[0]];
      // check that this node is a main node (auxilliary nodes are not inserted
      // into the mesh!):
      if (mesh_index != std::numeric_limits<unsigned int>::max()) {
        // special case, this entity is a point (which has already been
        // inserted)
        if (mi2gi[dim_mesh].size() <= mesh_index) {
          mi2gi[dim_mesh].resize(mesh_index + 1);
        }
        mi2gi[dim_mesh][mesh_index].push_back(end);
      }
    } else {
      // gmsh element is not a point -> insert entity:
      auto num_nodes =
          base::narrow<Eigen::Index>(end_element.NodeNumbers.size());
      Eigen::MatrixXd node_coords(dim_world, num_nodes);
      for (Eigen::Index i = 0; i < num_nodes; ++i) {
        auto node_coord =
            msh_file.Nodes[gi2i[end_element.NodeNumbers[i]]].second;
        if (dim_world == 2) {
          node_coords.col(i) = node_coord.topRows(2);
        } else {
          node_coords.col(i) = node_coord;
        }
      }
      std::unique_ptr<geometry::Geometry> geom;

      switch (end_element.Type) {
        case GMshFileV2::ElementType::EDGE2:
          ref_el = base::RefEl::kSegment();
          geom = std::make_unique<geometry::SegmentO1>(node_coords);
          break;
        case GMshFileV2::ElementType::EDGE3:
          ref_el = base::RefEl::kSegment();
          geom = std::make_unique<geometry::SegmentO2>(node_coords);
          break;
        case GMshFileV2::ElementType::TRIA3:
          ref_el = base::RefEl::kTria();
          geom = std::make_unique<geometry::TriaO1>(node_coords);
          break;
        case GMshFileV2::ElementType::TRIA6:
          ref_el = base::RefEl::kTria();
          geom = std::make_unique<geometry::TriaO2>(node_coords);
          break;
        case GMshFileV2::ElementType::QUAD4:
          ref_el = base::RefEl::kQuad();
          geom = std::make_unique<geometry::QuadO1>(node_coords);
          break;
        case GMshFileV2::ElementType::QUAD8:
          ref_el = base::RefEl::kQuad();
          geom = std::make_unique<geometry::QuadO2>(node_coords);
          break;
        case GMshFileV2::ElementType::QUAD9:
          ref_el = base::RefEl::kQuad();
          geom = std::make_unique<geometry::QuadO2>(node_coords.leftCols(8));
          break;
        default:
          LF_VERIFY_MSG(false, "Gmsh element type "
                                   << end_element.Type
                                   << " not (yet) supported by GmshReader.");
      }
      std::vector<size_type> main_nodes(ref_el.NumNodes());
      for (dim_t i = 0; i < ref_el.NumNodes(); ++i) {
        main_nodes[i] = gi2mi[end_element.NodeNumbers[i]];
      }

      mesh_factory_->AddEntity(ref_el, main_nodes, std::move(geom));
      mi2gi[codim].emplace_back(std::vector{static_cast<unsigned int>(end)});
    }
  }

  // 4) Construct mesh
  //////////////////////////////////////////////////////////////////////////////
  mesh_ = mesh_factory_->Build();

  // 5) Build MeshDataSet that assigns the physical entitiies:
  //////////////////////////////////////////////////////////////////////////////
  physical_nrs_ =
      mesh::utils::make_AllCodimMeshDataSet<std::vector<size_type>>(mesh_);

  for (dim_t c = 0; c <= dim_mesh; ++c) {
    for (const auto* const e : mesh_->Entities(c)) {
      auto mi = mesh_->Index(*e);
      if (c == dim_mesh && mi >= mi2gi[dim_mesh].size()) {
        // this point did not appear as a gmsh element in the file -> don't
        // assign any physical entity nr.
        continue;
      }
      if (mi2gi[c].size() > mi) {
        std::vector<size_type> temp;
        for (auto& gmsh_index : mi2gi[c][mi]) {
          temp.push_back(msh_file.Elements[gmsh_index].PhysicalEntityNr);
        }

        physical_nrs_->operator()(*e) = std::move(temp);
      }
    }
  }

  // 6) Create mapping physicalEntityNr <-> physicalEntityName:
  //////////////////////////////////////////////////////////////////////////

  for (const auto& pe : msh_file.PhysicalEntities) {
    name_2_nr_.insert(
        std::pair{pe.Name, std::pair{pe.Number, dim_mesh - pe.Dimension}});
    nr_2_name_.insert(
        std::pair{pe.Number, std::pair{pe.Name, dim_mesh - pe.Dimension}});
  }

  if (!msh_file.Periodic.empty()) {
    /*LOGGER_ENTRY(logger_,
                 "WARNING: GMSH File  contains periodic boundary relations "
                 "between elements. These are ignored by GmshReader.",
                 3);*/
  }
}